

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpt.cpp
# Opt level: O0

bool pg::pm_less(int *a,int *b,int k,int pl)

{
  bool bVar1;
  int local_2c;
  bool b_is_pl;
  bool a_is_pl;
  int i;
  int pl_local;
  int k_local;
  int *b_local;
  int *a_local;
  
  local_2c = 0;
  while( true ) {
    if (k <= local_2c) {
      return false;
    }
    if (a[local_2c] != b[local_2c]) break;
    local_2c = local_2c + 1;
  }
  if (a[local_2c] == -1) {
    return true;
  }
  if (b[local_2c] == -1) {
    return false;
  }
  bVar1 = (b[local_2c] & 1U) == pl;
  if ((a[local_2c] & 1U) == pl) {
    if (bVar1) {
      return a[local_2c] < b[local_2c];
    }
    return false;
  }
  if (bVar1) {
    return true;
  }
  return b[local_2c] < a[local_2c];
}

Assistant:

static bool
pm_less(int* a, int* b, int k, int pl)
{
    // remember: _ < 5 < 3 < 1 < 0 < 2 < 4 < 6 (even measures, solving for odd)
    // remember: _ < 6 < 4 < 2 < 0 < 1 < 3 < 5 (odd measures, solving for even)

    for (int i=0; i<k; i++) {
        // if equal, then continue with next
        if (a[i] == b[i]) continue;
        // cases where a[i] is _ or b[i] is _
        if (a[i] == -1) return true;
        if (b[i] == -1) return false;
        // case distinction based on parity
        const bool a_is_pl = (a[i]&1) == pl;
        const bool b_is_pl = (b[i]&1) == pl;
        if (a_is_pl) {
            if (b_is_pl) return a[i] < b[i];
            else return false;
        } else {
            if (b_is_pl) return true;
            else return a[i] > b[i];
        }
    }
    // they are equal, so not less...
    return false;
}